

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_http_proxy_get_destination
                   (Curl_cfilter *cf,char **phostname,int *pport,_Bool *pipv6_ip)

{
  connectdata *pcVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  _Bool _Var5;
  
  lVar4 = 0xe0;
  if ((((cf->conn->bits).field_0x1 & 1) == 0) && (lVar4 = 0xb0, cf->sockindex == 1)) {
    lVar4 = 200;
  }
  *phostname = *(char **)((long)&(cf->conn->cpool_node)._list + lVar4);
  pcVar1 = cf->conn;
  if (cf->sockindex == 1) {
    uVar2 = (uint)pcVar1->secondary_port;
  }
  else if (((pcVar1->bits).field_0x1 & 2) == 0) {
    uVar2 = pcVar1->remote_port;
  }
  else {
    uVar2 = pcVar1->conn_to_port;
  }
  *pport = uVar2;
  if (*phostname == (cf->conn->host).name) {
    _Var5 = (_Bool)((byte)(*(uint *)&cf->conn->bits >> 10) & 1);
  }
  else {
    pcVar3 = strchr(*phostname,0x3a);
    _Var5 = pcVar3 != (char *)0x0;
  }
  *pipv6_ip = _Var5;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_proxy_get_destination(struct Curl_cfilter *cf,
                                         const char **phostname,
                                         int *pport, bool *pipv6_ip)
{
  DEBUGASSERT(cf);
  DEBUGASSERT(cf->conn);

  if(cf->conn->bits.conn_to_host)
    *phostname = cf->conn->conn_to_host.name;
  else if(cf->sockindex == SECONDARYSOCKET)
    *phostname = cf->conn->secondaryhostname;
  else
    *phostname = cf->conn->host.name;

  if(cf->sockindex == SECONDARYSOCKET)
    *pport = cf->conn->secondary_port;
  else if(cf->conn->bits.conn_to_port)
    *pport = cf->conn->conn_to_port;
  else
    *pport = cf->conn->remote_port;

  if(*phostname != cf->conn->host.name)
    *pipv6_ip = (strchr(*phostname, ':') != NULL);
  else
    *pipv6_ip = cf->conn->bits.ipv6_ip;

  return CURLE_OK;
}